

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

ON_wString
ON_NTimesPowerOf10AsString
          (double value,double tol,ON_wString *g_format,ON__UINT64 n,int e,double *clean_value)

{
  bool bVar1;
  int iVar2;
  ON_wString *pOVar3;
  undefined4 in_register_00000014;
  double *in_R8;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dStack_120;
  int scan_count;
  double y;
  ulong local_110;
  ON__UINT64 r;
  size_t sfi;
  size_t sf_capacity;
  wchar_t sf [32];
  double x;
  int ie_1;
  int ie;
  ON__UINT64 f;
  ON__UINT64 i;
  ON__UINT64 q;
  double min_pretty_value;
  double max_pretty_value;
  double *clean_value_local;
  int e_local;
  ON__UINT64 n_local;
  ON_wString *g_format_local;
  double tol_local;
  double value_local;
  ON_wString *value_as_string;
  
  _ie_1 = CONCAT44(in_register_00000014,e);
  iVar2 = (int)clean_value;
  if (in_R8 != (double *)0x0) {
    *in_R8 = value;
  }
  bVar1 = ON_IsValid(value);
  if (bVar1) {
    if ((1e+18 <= ABS(value)) || (ABS(value) <= 1e-18)) {
      pOVar3 = ON_NTimesPowerOf10AsStringFail((ON_wString *)n,false);
      ON_wString::ON_wString(g_format,pOVar3);
    }
    else {
      i = 1;
      if (iVar2 < 0) {
        for (x._0_4_ = 0; iVar2 < x._0_4_; x._0_4_ = x._0_4_ + -1) {
          i = i * 10;
        }
        auVar7._8_4_ = in_register_00000014;
        auVar7._0_8_ = _ie_1;
        auVar7._12_4_ = 0x45300000;
        auVar9._8_4_ = (int)(i >> 0x20);
        auVar9._0_8_ = i;
        auVar9._12_4_ = 0x45300000;
        if (ABS((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,e) - 4503599627370496.0)) <=
            ABS((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0)) * 1e-18) {
          pOVar3 = ON_NTimesPowerOf10AsStringFail((ON_wString *)n,false);
          ON_wString::ON_wString(g_format,pOVar3);
          return (ON_wString)(wchar_t *)g_format;
        }
        f = _ie_1 / i;
        _ie_1 = _ie_1 % i;
      }
      else {
        for (x._4_4_ = 0; x._4_4_ < iVar2; x._4_4_ = x._4_4_ + 1) {
          i = i * 10;
        }
        auVar4._8_4_ = in_register_00000014;
        auVar4._0_8_ = _ie_1;
        auVar4._12_4_ = 0x45300000;
        auVar6._8_4_ = (int)(i >> 0x20);
        auVar6._0_8_ = i;
        auVar6._12_4_ = 0x45300000;
        if (1e+18 <= ABS((auVar4._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,e) - 4503599627370496.0)) *
                     ABS((auVar6._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0))) {
          pOVar3 = ON_NTimesPowerOf10AsStringFail((ON_wString *)n,false);
          ON_wString::ON_wString(g_format,pOVar3);
          return (ON_wString)(wchar_t *)g_format;
        }
        f = _ie_1 * i;
        _ie_1 = 0;
      }
      auVar5._8_4_ = (int)(f >> 0x20);
      auVar5._0_8_ = f;
      auVar5._12_4_ = 0x45300000;
      auVar8._8_4_ = (int)(_ie_1 >> 0x20);
      auVar8._0_8_ = _ie_1;
      auVar8._12_4_ = 0x45300000;
      auVar10._8_4_ = (int)(i >> 0x20);
      auVar10._0_8_ = i;
      auVar10._12_4_ = 0x45300000;
      sf._120_8_ = (auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)f) - 4503599627370496.0) +
                   ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)_ie_1) - 4503599627370496.0)) /
                   ((auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0));
      if (ABS((double)sf._120_8_ - value) <= tol) {
        if (_ie_1 == 0) {
          if (in_R8 != (double *)0x0) {
            *in_R8 = (double)sf._120_8_;
          }
          ON_wString::FormatToString((wchar_t *)g_format,L"%llu",f);
          return (ON_wString)(wchar_t *)g_format;
        }
        memset(&sf_capacity,0,0x80);
        sfi = 0x20;
        r = 0;
        while (local_110 = i / 10, local_110 != 0 && r < 0x20) {
          sf[r - 2] = (int)((_ie_1 / local_110) % 10) + L'0';
          r = r + 1;
          i = local_110;
        }
        y._7_1_ = 0;
        ON_wString::FormatToString((wchar_t *)g_format,L"%llu.%ls",f,&sf_capacity);
        dStack_120 = ON_DBL_QNAN;
        iVar2 = ON_wString::Scan(g_format,L"%lf",&stack0xfffffffffffffee0);
        if ((iVar2 != 1) || (tol < ABS(dStack_120 - value))) {
          bVar1 = false;
        }
        else {
          if (in_R8 != (double *)0x0) {
            *in_R8 = dStack_120;
          }
          y._7_1_ = 1;
          bVar1 = true;
        }
        if ((y._7_1_ & 1) == 0) {
          ON_wString::~ON_wString(g_format);
        }
        if (bVar1) {
          return (ON_wString)(wchar_t *)g_format;
        }
      }
      pOVar3 = ON_NTimesPowerOf10AsStringFail((ON_wString *)n,false);
      ON_wString::ON_wString(g_format,pOVar3);
    }
  }
  else {
    pOVar3 = ON_NTimesPowerOf10AsStringFail((ON_wString *)n,false);
    ON_wString::ON_wString(g_format,pOVar3);
  }
  return (ON_wString)(wchar_t *)g_format;
}

Assistant:

static
const ON_wString ON_NTimesPowerOf10AsString(
  double value,
  double tol,
  const ON_wString& g_format,
  ON__UINT64 n,
  int e,
  double* clean_value
)
{
  if (nullptr != clean_value)
    *clean_value = value;

  if ( false == ON_IsValid(value) )
    return ON_NTimesPowerOf10AsStringFail(g_format,false); // value is a nan or UNSET value.

  // ON__UINT64 range is 0 to 18,446,744,073,709,551,615 = 1.8...e19
  const double max_pretty_value = 1.0e18; // must be <= 18,446,744,073,709,551,615 ( 20 decimal digits )
  const double min_pretty_value = 1.0 / max_pretty_value;
  if (fabs(value) >= max_pretty_value || fabs(value) <= min_pretty_value)
    return ON_NTimesPowerOf10AsStringFail(g_format,false); // value is too big or too small for a "pretty" format.
  

  // returns n*(10^e) as a "pretty" string - no exponential notation that disturbs users.
  ON__UINT64 q = 1;
  ON__UINT64 i = 0;
  ON__UINT64 f = 0;

  if (e >= 0)
  {
    for (int ie = 0; ie < e; ie++)
      q *= 10;

    if (fabs((double)n)*fabs((double)q) >= max_pretty_value)
      return ON_NTimesPowerOf10AsStringFail(g_format,false);

    i = n*q;
    f = 0;
  }
  else
  {
    // e is negative
    for (int ie = 0; ie > e; ie--)
      q *= 10;
    if (fabs((double)n) <= min_pretty_value*fabs((double)q))
      return ON_NTimesPowerOf10AsStringFail(g_format,false);

    i = n / q;
    f = n % q;
  }

  const double x = ((double)i) + ((double)f) / ((double)q);
  if (fabs(x - value) <= tol)
  {
    if (0 == f)
    {
      if (nullptr != clean_value)
        *clean_value = x;
      return ON_wString::FormatToString(L"%llu", i);
    }
    wchar_t sf[32] = { 0 }; // 32 is more than enough to hold the maximum of 20 digits
    size_t sf_capacity = sizeof(sf) / sizeof(sf[i]);
    size_t sfi = 0;
    for (ON__UINT64 r = q / 10; r > 0 && sfi < sf_capacity; r /= 10)
    {
      sf[sfi++] = (wchar_t)(int((f / r)%10) + '0');
    }
    const ON_wString value_as_string = ON_wString::FormatToString(L"%llu.%ls", i, sf);
    double y = ON_DBL_QNAN;
    const int scan_count = value_as_string.Scan( L"%lf", &y );
    if (1 == scan_count && fabs(y - value) <= tol)
    {
      if (nullptr != clean_value)
        *clean_value = y;
      return value_as_string;
    }
  }

  return ON_NTimesPowerOf10AsStringFail(g_format,false);
}